

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::DeviceMemory>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  DeviceInterface *vk;
  VkDevice device;
  Unique<vk::Handle<(vk::HandleType)7>_> obj;
  VkDeviceMemory local_78;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_70;
  Move<vk::Handle<(vk::HandleType)7>_> local_50;
  
  vk = Context::getDeviceInterface((Context *)this);
  device = Context::getDevice((Context *)this);
  Context::getUniversalQueueFamilyIndex((Context *)this);
  local_78.m_internal._0_4_ = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
  DStack_70.m_deviceIface = (DeviceInterface *)0x0;
  DStack_70.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(DStack_70.m_allocator._4_4_,(deUint32)params.size);
  DStack_70.m_device = (VkDevice)context;
  ::vk::allocateMemory
            (&local_50,vk,device,(VkMemoryAllocateInfo *)&local_78,(VkAllocationCallbacks *)0x0);
  local_78.m_internal._4_4_ =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_;
  local_78.m_internal._0_4_ =
       (undefined4)local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  DStack_70.m_deviceIface =
       (DeviceInterface *)
       CONCAT44(local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface.
                _4_4_,local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                      m_deviceIface._0_4_);
  DStack_70.m_device =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  DStack_70.m_allocator =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()(&DStack_70,local_78);
  }
  local_78.m_internal = (deUint64)&DStack_70.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_78.m_internal,
             (undefined1 *)
             ((long)&(DStack_70.m_deviceIface)->_vptr_DeviceInterface + local_78.m_internal));
  if ((VkDevice *)local_78.m_internal != &DStack_70.m_device) {
    operator_delete((void *)local_78.m_internal,(ulong)(DStack_70.m_device + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}